

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageErrorsTest::Test1D(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  bool is_ok;
  Functions *gl;
  StorageErrorsTest *this_local;
  long lVar9;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  (**(code **)(lVar9 + 0x1440))(this->m_to_invalid,1,0x8229,8);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glTextureStorage1D","texture is not the name of an existing texture object.");
  (**(code **)(lVar9 + 0x1440))(this->m_to_1D,1,this->m_internalformat_invalid,8);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                     "glTextureStorage1D","internalformat is not a valid sized internal format.");
  (**(code **)(lVar9 + 0x1440))(this->m_to_2D,1,0x8229,8);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                     "glTextureStorage1D",
                     "the effective target of texture is not one of the accepted targets.");
  (**(code **)(lVar9 + 0x1440))(this->m_to_1D,0,0x8229,8);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glTextureStorage1D","levels is less than 1.");
  (**(code **)(lVar9 + 0x1440))(this->m_to_1D,1,0x8229,0);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glTextureStorage1D","width is less than 1.");
  (**(code **)(lVar9 + 0x1440))(this->m_to_1D,8,0x8229);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glTextureStorage1D","levels is greater than log2(width)+1.");
  return ((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6;
}

Assistant:

bool StorageErrorsTest::Test1D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/*  Check that INVALID_OPERATION is generated by TextureStorage1D if texture
	 is not the name of an existing texture object. */
	{
		gl.textureStorage1D(m_to_invalid, 1, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage1D",
								  "texture is not the name of an existing texture object.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage1D if
	 internalformat is not a valid sized internal format. */
	{
		gl.textureStorage1D(m_to_1D, 1, m_internalformat_invalid, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage1D",
								  "internalformat is not a valid sized internal format.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage1D if target or
	 the effective target of texture is not one of the accepted targets
	 described above. */
	{
		gl.textureStorage1D(m_to_2D, 1, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage1D",
								  "the effective target of texture is not one of the accepted targets.");
	}

	/*  Check that INVALID_VALUE is generated by TextureStorage1D if width or
	 levels are less than 1. */
	{
		gl.textureStorage1D(m_to_1D, 0, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage1D", "levels is less than 1.");

		gl.textureStorage1D(m_to_1D, 1, GL_R8, 0);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage1D", "width is less than 1.");
	}

	/*  Check that INVALID_OPERATION is generated by TextureStorage1D if levels
	 is greater than log2(width)+1. */
	{
		gl.textureStorage1D(m_to_1D, 8, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage1D",
								  "levels is greater than log2(width)+1.");
	}

	return is_ok;
}